

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_jumpIfFalse
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t condition,sysbvm_tuple_t destination)

{
  sysbvm_tuple_t sVar1;
  
  sVar1 = sysbvm_array_create(context,2);
  if ((sVar1 & 0xf) == 0 && sVar1 != 0) {
    *(sysbvm_tuple_t *)(sVar1 + 0x10) = condition;
    *(sysbvm_tuple_t *)(sVar1 + 0x18) = destination;
  }
  sVar1 = sysbvm_functionBytecodeAssemblerInstruction_create(context,'&',sVar1);
  sysbvm_functionBytecodeAssembler_addInstruction(assembler,sVar1);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_jumpIfFalse(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t condition, sysbvm_tuple_t destination)
{
    sysbvm_tuple_t operands = sysbvm_array_create(context, 2);
    sysbvm_array_atPut(operands, 0, condition);
    sysbvm_array_atPut(operands, 1, destination);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_JUMP_IF_FALSE, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}